

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

bool __thiscall
testing::internal::
TypedExpectation<pstore::serialize::archive::void_type_(pstore::gsl::span<int,_-1L>)>::
ShouldHandleArguments
          (TypedExpectation<pstore::serialize::archive::void_type_(pstore::gsl::span<int,__1L>)>
           *this,ArgumentTuple *args)

{
  bool bVar1;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  ExpectationBase::CheckActionCountIfNotDone(&this->super_ExpectationBase);
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  if ((this->super_ExpectationBase).retired_ == false) {
    bVar1 = ExpectationBase::AllPrerequisitesAreSatisfied(&this->super_ExpectationBase);
    if (bVar1) {
      bVar1 = Matches(this,args);
      return bVar1;
    }
  }
  return false;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();

    // In case the action count wasn't checked when the expectation
    // was defined (e.g. if this expectation has no WillRepeatedly()
    // or RetiresOnSaturation() clause), we check it when the
    // expectation is used for the first time.
    CheckActionCountIfNotDone();
    return !is_retired() && AllPrerequisitesAreSatisfied() && Matches(args);
  }